

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_exec(opj_jp2_t *jp2,opj_procedure_list_t *p_procedure_list,
                     opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  bool local_3d;
  uint local_3c;
  OPJ_UINT32 i;
  OPJ_UINT32 l_nb_proc;
  OPJ_BOOL l_result;
  _func_OPJ_BOOL_opj_jp2_t_ptr_opj_stream_private_t_ptr_opj_event_mgr_t_ptr **l_procedure;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *stream_local;
  opj_procedure_list_t *p_procedure_list_local;
  opj_jp2_t *jp2_local;
  
  i = 1;
  if (p_procedure_list == (opj_procedure_list_t *)0x0) {
    __assert_fail("p_procedure_list != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8cb,
                  "OPJ_BOOL opj_jp2_exec(opj_jp2_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8cc,
                  "OPJ_BOOL opj_jp2_exec(opj_jp2_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8cd,
                  "OPJ_BOOL opj_jp2_exec(opj_jp2_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    OVar1 = opj_procedure_list_get_nb_procedures(p_procedure_list);
    _l_nb_proc = opj_procedure_list_get_first_procedure(p_procedure_list);
    for (local_3c = 0; local_3c < OVar1; local_3c = local_3c + 1) {
      local_3d = false;
      if (i != 0) {
        iVar2 = (**_l_nb_proc)(jp2,stream,p_manager);
        local_3d = iVar2 != 0;
      }
      i = (OPJ_UINT32)local_3d;
      _l_nb_proc = _l_nb_proc + 1;
    }
    opj_procedure_list_clear(p_procedure_list);
    return i;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x8ce,
                "OPJ_BOOL opj_jp2_exec(opj_jp2_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_exec (  opj_jp2_t * jp2,
                                opj_procedure_list_t * p_procedure_list,
                                opj_stream_private_t *stream,
                                opj_event_mgr_t * p_manager
                                )

{
	OPJ_BOOL (** l_procedure) (opj_jp2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *) = 00;
	OPJ_BOOL l_result = OPJ_TRUE;
	OPJ_UINT32 l_nb_proc, i;

	/* preconditions */
	assert(p_procedure_list != 00);
	assert(jp2 != 00);
	assert(stream != 00);
	assert(p_manager != 00);

	l_nb_proc = opj_procedure_list_get_nb_procedures(p_procedure_list);
	l_procedure = (OPJ_BOOL (**) (opj_jp2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *)) opj_procedure_list_get_first_procedure(p_procedure_list);

	for	(i=0;i<l_nb_proc;++i) {
		l_result = l_result && (*l_procedure) (jp2,stream,p_manager);
		++l_procedure;
	}

	/* and clear the procedure list at the end. */
	opj_procedure_list_clear(p_procedure_list);
	return l_result;
}